

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O2

UResourceBundle *
ures_getByKey_63(UResourceBundle *resB,char *inKey,UResourceBundle *fillIn,UErrorCode *status)

{
  uint table;
  ResourceData *pResData;
  UResourceDataEntry *realData_00;
  char *key;
  Resource local_3c;
  UResourceDataEntry *realData;
  int32_t t;
  
  realData = (UResourceDataEntry *)0x0;
  if ((status != (UErrorCode *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (resB == (UResourceBundle *)0x0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      table = resB->fRes;
      if ((table & 0xf0000000) == 0x20000000 || (table & 0xe0000000) == 0x40000000) {
        pResData = &resB->fResData;
        key = inKey;
        local_3c = res_getTableItemByKey_63(pResData,table,&t,&key);
        if (local_3c == 0xffffffff) {
          if ((resB->fHasFallback != '\x01') ||
             (key = inKey, pResData = getFallbackData(resB,&key,&realData,&local_3c,status),
             realData_00 = realData, U_ZERO_ERROR < *status)) {
            *status = U_MISSING_RESOURCE_ERROR;
            return fillIn;
          }
        }
        else {
          realData_00 = resB->fData;
        }
        fillIn = init_resb_result(pResData,local_3c,key,-1,realData_00,resB,0,fillIn,status);
      }
      else {
        *status = U_RESOURCE_TYPE_MISMATCH;
      }
    }
  }
  return fillIn;
}

Assistant:

U_CAPI UResourceBundle* U_EXPORT2 ures_getByKey(const UResourceBundle *resB, const char* inKey, UResourceBundle *fillIn, UErrorCode *status) {
    Resource res = RES_BOGUS;
    UResourceDataEntry *realData = NULL;
    const char *key = inKey;

    if (status==NULL || U_FAILURE(*status)) {
        return fillIn;
    }
    if(resB == NULL) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return fillIn;
    }

    int32_t type = RES_GET_TYPE(resB->fRes);
    if(URES_IS_TABLE(type)) {
        int32_t t;
        res = res_getTableItemByKey(&(resB->fResData), resB->fRes, &t, &key);
        if(res == RES_BOGUS) {
            key = inKey;
            if(resB->fHasFallback == TRUE) {
                const ResourceData *rd = getFallbackData(resB, &key, &realData, &res, status);
                if(U_SUCCESS(*status)) {
                  /* check if resB->fResPath gives the right name here */
                    return init_resb_result(rd, res, key, -1, realData, resB, 0, fillIn, status);
                } else {
                    *status = U_MISSING_RESOURCE_ERROR;
                }
            } else {
                *status = U_MISSING_RESOURCE_ERROR;
            }
        } else {
            return init_resb_result(&(resB->fResData), res, key, -1, resB->fData, resB, 0, fillIn, status);
        }
    } 
#if 0
    /* this is a kind of TODO item. If we have an array with an index table, we could do this. */
    /* not currently */
    else if(RES_GET_TYPE(resB->fRes) == URES_ARRAY && resB->fHasFallback == TRUE) {
        /* here should go a first attempt to locate the key using index table */
        const ResourceData *rd = getFallbackData(resB, &key, &realData, &res, status);
        if(U_SUCCESS(*status)) {
            return init_resb_result(rd, res, key, realData, resB, fillIn, status);
        } else {
            *status = U_MISSING_RESOURCE_ERROR;
        }
    }
#endif    
    else {
        *status = U_RESOURCE_TYPE_MISMATCH;
    }